

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

MDDEntry * __thiscall ASDCP::Dictionary::FindULExact(Dictionary *this,byte_t *ul_buf)

{
  bool bVar1;
  ILogSink *this_00;
  char *pcVar2;
  pointer ppVar3;
  undefined1 local_c8 [8];
  UL tmp_ul;
  char buf [64];
  _Self local_60 [3];
  UL local_48;
  _Self local_28;
  const_iterator i;
  byte_t *ul_buf_local;
  Dictionary *this_local;
  
  i._M_node = (_Base_ptr)ul_buf;
  if (*this->m_MDD_Table[0].name != '\0') {
    UL::UL(&local_48,ul_buf);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::find(&this->m_md_lookup,&local_48);
    UL::~UL(&local_48);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_unsigned_int,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_unsigned_int>_>_>
         ::end(&this->m_md_lookup);
    bVar1 = std::operator==(&local_28,local_60);
    if (bVar1) {
      UL::UL((UL *)local_c8,(byte_t *)i._M_node);
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar2 = UL::EncodeString((UL *)local_c8,(char *)(tmp_ul.super_Identifier<16U>.m_Value + 0xf),
                                0x40);
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL: %s\n",pcVar2);
      this_local = (Dictionary *)0x0;
      UL::~UL((UL *)local_c8);
    }
    else {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_ASDCP::UL,_unsigned_int>_>::operator->
                         (&local_28);
      this_local = (Dictionary *)(this->m_MDD_Table + ppVar3->second);
    }
    return (MDDEntry *)this_local;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x15c,"const ASDCP::MDDEntry *ASDCP::Dictionary::FindULExact(const byte_t *) const"
               );
}

Assistant:

const ASDCP::MDDEntry*
ASDCP::Dictionary::FindULExact(const byte_t* ul_buf) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<UL, ui32_t>::const_iterator i = m_md_lookup.find(UL(ul_buf));
  
  if ( i == m_md_lookup.end() )
    {
      char buf[64];
      UL tmp_ul(ul_buf);
      Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL: %s\n", tmp_ul.EncodeString(buf, 64));
      return 0;
    }

  return &m_MDD_Table[i->second];
}